

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMA.hpp
# Opt level: O2

uint8_t __thiscall PCCompatible::i8237::status(i8237 *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  
  bVar1 = (this->channels_)._M_elems[0].request;
  bVar2 = (this->channels_)._M_elems[0].transfer_complete;
  bVar3 = (this->channels_)._M_elems[1].transfer_complete;
  bVar4 = (this->channels_)._M_elems[2].transfer_complete;
  bVar5 = (this->channels_)._M_elems[3].transfer_complete;
  bVar6 = (this->channels_)._M_elems[1].request;
  bVar7 = (this->channels_)._M_elems[2].request;
  bVar8 = (this->channels_)._M_elems[3].request;
  for (lVar9 = 0x1d; lVar9 != 0x7d; lVar9 = lVar9 + 0x18) {
    *(undefined1 *)((long)(this->channels_)._M_elems + lVar9 + -0xc) = 0;
  }
  return bVar8 << 7 | bVar7 << 6 |
         bVar6 << 5 | bVar1 << 4 | bVar5 << 3 | bVar4 << 2 | bVar3 * '\x02' | bVar2;
}

Assistant:

uint8_t status() {
			const uint8_t result =
				(channels_[0].transfer_complete ? 0x01 : 0x00) |
				(channels_[1].transfer_complete ? 0x02 : 0x00) |
				(channels_[2].transfer_complete ? 0x04 : 0x00) |
				(channels_[3].transfer_complete ? 0x08 : 0x00) |

				(channels_[0].request ? 0x10 : 0x00) |
				(channels_[1].request ? 0x20 : 0x00) |
				(channels_[2].request ? 0x40 : 0x00) |
				(channels_[3].request ? 0x80 : 0x00);

			for(auto &channel : channels_) {
				channel.transfer_complete = false;
			}

//			printf("DMA: status is %02x\n", result);

			return result;
		}